

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O1

void __thiscall chrono::utils::ChParserOpenSim::ChParserOpenSim(ChParserOpenSim *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->m_report).bodies._M_h._M_buckets = &(this->m_report).bodies._M_h._M_single_bucket;
  (this->m_report).bodies._M_h._M_bucket_count = 1;
  (this->m_report).bodies._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_report).bodies._M_h._M_element_count = 0;
  (this->m_report).bodies._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_report).bodies._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_report).bodies._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_report).joints._M_h._M_buckets = &(this->m_report).joints._M_h._M_single_bucket;
  (this->m_report).joints._M_h._M_bucket_count = 1;
  (this->m_report).joints._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_report).joints._M_h._M_element_count = 0;
  (this->m_report).joints._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_report).joints._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_report).joints._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_report).forces._M_h._M_buckets = &(this->m_report).forces._M_h._M_single_bucket;
  (this->m_report).forces._M_h._M_bucket_count = 1;
  (this->m_report).forces._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_report).forces._M_h._M_element_count = 0;
  (this->m_report).forces._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_report).forces._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_report).forces._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->function_table)._M_t._M_impl.super__Rb_tree_header;
  (this->function_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->function_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->function_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->function_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->function_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_verbose = false;
  this->m_visType = NONE;
  this->m_collide = false;
  this->m_family_1 = 1;
  this->m_family_2 = 2;
  this->m_activate_actuators = false;
  this->m_friction = 0.6;
  this->m_restitution = 0.4;
  this->m_young_modulus = 200000.0;
  this->m_poisson_ratio = 0.3;
  this->m_kn = 200000.0;
  this->m_gn = 40.0;
  this->m_kt = 200000.0;
  this->m_gt = 20.0;
  (this->m_datapath)._M_dataplus._M_p = (pointer)&(this->m_datapath).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_datapath,"opensim/","");
  (this->m_jointList).
  super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_jointList).
  super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_jointList).
  super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initFunctionTable(this);
  return;
}

Assistant:

ChParserOpenSim::ChParserOpenSim()
    : m_collide(false),
      m_family_1(1),
      m_family_2(2),
      m_visType(VisType::NONE),
      m_verbose(false),
      m_activate_actuators(false),
      m_friction(0.6f),
      m_restitution(0.4f),
      m_young_modulus(2e5f),
      m_poisson_ratio(0.3f),
      m_kn(2e5),
      m_kt(2e5),
      m_gn(40),
      m_gt(20),
      m_datapath("opensim/") {
    initFunctionTable();
}